

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  char *pcVar1;
  string *psVar2;
  ostream *poVar3;
  cmGeneratedFileStream fout;
  undefined1 local_260 [16];
  _func_int *local_250 [2];
  byte abStack_240 [552];
  
  pcVar1 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)local_260);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (*lg->_vptr_cmLocalGenerator[0xc])(local_260,lg,target);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_260._0_8_);
  if ((_func_int **)local_260._0_8_ != local_250) {
    operator_delete((void *)local_260._0_8_,(ulong)(local_250[0] + 1));
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(psVar2->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_260,(__return_storage_ptr__->_M_dataplus)._M_p,false,
             None);
  if ((abStack_240[(long)*(_func_int **)(local_260._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_260,"# This is a dummy file for the OBJECT library ",0x2e);
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_260,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," for the CMake CodeBlocks project generator.\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"# Don\'t edit, this file will be overwritten.\n",0x2d);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_260);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
  cmLocalGenerator* lg, cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = lg->GetCurrentBinaryDirectory();
  filename += "/";
  filename += lg->GetTargetDirectory(target);
  filename += "/";
  filename += target->GetName();
  filename += ".objlib";
  cmGeneratedFileStream fout(filename.c_str());
  if (fout) {
    /* clang-format off */
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    /* clang-format on */
  }
  return filename;
}